

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_unitAttributePrefix_Test::TestBody(Units_unitAttributePrefix_Test *this)

{
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_140 [8];
  Message local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  Message local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  AssertHelper local_70 [8];
  Message local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  UnitsPtr u;
  Units_unitAttributePrefix_Test *this_local;
  
  libcellml::Units::create();
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Units::unitAttributePrefix_abi_cxx11_((ulong)&local_50);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_30,"\"\"","u->unitAttributePrefix(0)",(char (*) [1])0x18cba0,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x327,pcVar2);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"NewUnit",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar3,(int)local_90,1.05,17.0,(string *)0x4);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Units::unitAttributePrefix_abi_cxx11_((ulong)&local_f0);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_d0,"\"4\"","u->unitAttributePrefix(0)",(char (*) [2])0x18cbc9,
             &local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x32a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  libcellml::Units::unitAttributePrefix_abi_cxx11_((ulong)&local_130);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_110,"\"\"","u->unitAttributePrefix(3)",(char (*) [1])0x18cba0,
             &local_130);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x32b,pcVar2);
    testing::internal::AssertHelper::operator=(local_140,local_138);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    testing::Message::~Message(local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&gtest_ar.message_)
  ;
  return;
}

Assistant:

TEST(Units, unitAttributePrefix)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    EXPECT_EQ("", u->unitAttributePrefix(0));
    u->addUnit("NewUnit", 4, 1.05, 17.0);

    EXPECT_EQ("4", u->unitAttributePrefix(0));
    EXPECT_EQ("", u->unitAttributePrefix(3));
}